

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O1

void __thiscall
QHttpNetworkConnectionPrivate::startNetworkLayerStateLookup(QHttpNetworkConnectionPrivate *this)

{
  long lVar1;
  QHttpNetworkConnectionChannel *this_00;
  
  this->networkLayerState = IPv4or6;
  this_00 = this->channels;
  if (this->activeChannelCount < 2) {
    this_00->networkLayerPreference = AnyIPProtocol;
  }
  else {
    this_00->networkLayerPreference = IPv4Protocol;
    this_00[1].networkLayerPreference = IPv6Protocol;
    QTimer::start((int)this + 0xa8);
    lVar1 = 0x108;
    if (this->delayIpv4 == false) {
      lVar1 = 0;
    }
    this_00 = (QHttpNetworkConnectionChannel *)(&this->channels->super_QObject + lVar1);
  }
  QHttpNetworkConnectionChannel::ensureConnection((QHttpNetworkConnectionChannel *)this_00);
  return;
}

Assistant:

void QHttpNetworkConnectionPrivate::startNetworkLayerStateLookup()
{
    if (activeChannelCount > 1) {
        // At this time all channels should be unconnected.
        Q_ASSERT(!channels[0].isSocketBusy());
        Q_ASSERT(!channels[1].isSocketBusy());

        networkLayerState = IPv4or6;

        channels[0].networkLayerPreference = QAbstractSocket::IPv4Protocol;
        channels[1].networkLayerPreference = QAbstractSocket::IPv6Protocol;

        int timeout = 300;
        delayedConnectionTimer.start(timeout);
        if (delayIpv4)
            channels[1].ensureConnection();
        else
            channels[0].ensureConnection();
    } else {
        networkLayerState = IPv4or6;
        channels[0].networkLayerPreference = QAbstractSocket::AnyIPProtocol;
        channels[0].ensureConnection();
    }
}